

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O1

RunnerContext * GetNextContext(Runner *runner)

{
  ulong uVar1;
  RunnerContext *in_RAX;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar2 = (ulong)runner->totalContexts;
  bVar4 = 0 < (long)uVar2;
  if (0 < (long)uVar2) {
    in_RAX = (RunnerContext *)runner->contextUsed;
    if (*(char *)&in_RAX->node == '\x01') {
      uVar1 = 1;
      do {
        uVar3 = uVar1;
        if (uVar2 == uVar3) {
          bVar4 = uVar3 < uVar2;
          goto LAB_00106481;
        }
        uVar1 = uVar3 + 1;
      } while (*(char *)((long)&in_RAX->node + uVar3) != '\0');
      bVar4 = uVar3 < uVar2;
    }
    else {
      uVar3 = 0;
    }
    *(undefined1 *)((long)&in_RAX->node + uVar3) = 1;
    in_RAX = runner->contexts + uVar3;
  }
LAB_00106481:
  if (bVar4) {
    return in_RAX;
  }
  puts("Ran out of contexts");
  exit(0);
}

Assistant:

RunnerContext* GetNextContext(Runner* runner) {
  for (int i = 0; i < runner->totalContexts; i++) {
    if (!runner->contextUsed[i]) {
      runner->contextUsed[i] = true;
      return &runner->contexts[i];  
    }
  }

  RUNTIME_ERROR("Ran out of contexts");
}